

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AhoCorasickPlus.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
AhoCorasickPlus::findAll
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AhoCorasickPlus *this,
          string *text,bool keep)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  AC_MATCH_t local_48;
  
  search(this,text,keep);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ac_trie_findnext(&local_48,this->m_automata);
    sVar2 = local_48.size;
    if (local_48.size == 0) break;
    lVar1 = CONCAT44(local_48.patterns._4_4_,local_48.patterns._0_4_);
    for (uVar3 = 0; uVar3 < sVar2; uVar3 = uVar3 + 1) {
      local_48.patterns._0_4_ = *(undefined4 *)(lVar1 + 0x20 + (ulong)uVar3 * 0x30);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> AhoCorasickPlus::findAll (const std::string& text, bool keep)
{
  this->search(text, keep);

  std::vector<int> IDs;
  AC_MATCH_t matchp;
  unsigned int j;

  while ((matchp = ac_trie_findnext (m_automata)).size)
  {
      for (j = 0; j < matchp.size; j++)
      {
          // Add the id to our vector
          IDs.push_back(matchp.patterns[j].id.u.number);
      }
  }

  return IDs;
}